

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  ulong uVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  ulong *puVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  vint4 bi;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vint4 ai;
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  float fVar38;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar39 [64];
  undefined1 auVar43 [16];
  uint uVar45;
  uint uVar46;
  uint uVar47;
  undefined1 auVar44 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [32];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined4 local_a10;
  undefined4 uStack_a0c;
  undefined4 uStack_a08;
  undefined4 uStack_a04;
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9b0 [16];
  float local_9a0 [4];
  undefined1 local_990 [16];
  float local_980 [4];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  puVar18 = local_7f8;
  local_800 = root.ptr;
  fVar38 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_a30._4_4_ = fVar38;
  local_a30._0_4_ = fVar38;
  local_a30._8_4_ = fVar38;
  local_a30._12_4_ = fVar38;
  auVar30 = ZEXT1664(local_a30);
  fVar40 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_a40._4_4_ = fVar40;
  local_a40._0_4_ = fVar40;
  local_a40._8_4_ = fVar40;
  local_a40._12_4_ = fVar40;
  auVar33 = ZEXT1664(local_a40);
  fVar41 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_a50._4_4_ = fVar41;
  local_a50._0_4_ = fVar41;
  local_a50._8_4_ = fVar41;
  local_a50._12_4_ = fVar41;
  auVar35 = ZEXT1664(local_a50);
  fVar38 = fVar38 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar40 = fVar40 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar41 = fVar41 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_a60._0_8_ = CONCAT44(fVar38,fVar38) ^ 0x8000000080000000;
  local_a60._8_4_ = -fVar38;
  local_a60._12_4_ = -fVar38;
  auVar37 = ZEXT1664(local_a60);
  local_a70._0_8_ = CONCAT44(fVar40,fVar40) ^ 0x8000000080000000;
  local_a70._8_4_ = -fVar40;
  local_a70._12_4_ = -fVar40;
  auVar39 = ZEXT1664(local_a70);
  iVar10 = (tray->tnear).field_0.i[k];
  local_a80._4_4_ = iVar10;
  local_a80._0_4_ = iVar10;
  local_a80._8_4_ = iVar10;
  local_a80._12_4_ = iVar10;
  auVar44 = ZEXT1664(local_a80);
  local_a10 = 0x80000000;
  uStack_a0c = 0x80000000;
  uStack_a08 = 0x80000000;
  uStack_a04 = 0x80000000;
  local_a90._0_8_ = CONCAT44(fVar41,fVar41) ^ 0x8000000080000000;
  local_a90._8_4_ = -fVar41;
  local_a90._12_4_ = -fVar41;
  auVar36 = ZEXT1664(local_a90);
  iVar10 = (tray->tfar).field_0.i[k];
  local_aa0._4_4_ = iVar10;
  local_aa0._0_4_ = iVar10;
  local_aa0._8_4_ = iVar10;
  local_aa0._12_4_ = iVar10;
  auVar49 = ZEXT1664(local_aa0);
  iVar10 = 1 << ((uint)k & 0x1f);
  auVar25._4_4_ = iVar10;
  auVar25._0_4_ = iVar10;
  auVar25._8_4_ = iVar10;
  auVar25._12_4_ = iVar10;
  auVar25._16_4_ = iVar10;
  auVar25._20_4_ = iVar10;
  auVar25._24_4_ = iVar10;
  auVar25._28_4_ = iVar10;
  auVar6 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar25 = vpand_avx2(auVar25,auVar6);
  local_940 = vpcmpeqd_avx2(auVar25,auVar6);
  bVar9 = true;
  local_a20._8_4_ = 0x7fffffff;
  local_a20._0_8_ = 0x7fffffff7fffffff;
  local_a20._12_4_ = 0x7fffffff;
  do {
    uVar21 = puVar18[-1];
    puVar18 = puVar18 + -1;
    while ((uVar21 & 8) == 0) {
      auVar8 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + uVar19),auVar37._0_16_,
                               auVar30._0_16_);
      auVar54 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + uVar22),auVar39._0_16_,
                                auVar33._0_16_);
      auVar8 = vpmaxsd_avx(auVar8,auVar54);
      auVar54 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + uVar20),auVar36._0_16_,
                                auVar35._0_16_);
      auVar54 = vpmaxsd_avx(auVar54,auVar44._0_16_);
      auVar8 = vpmaxsd_avx(auVar8,auVar54);
      auVar54 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + (uVar19 ^ 0x10)),
                                auVar37._0_16_,auVar30._0_16_);
      auVar57 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + (uVar22 ^ 0x10)),
                                auVar39._0_16_,auVar33._0_16_);
      auVar54 = vpminsd_avx(auVar54,auVar57);
      auVar57 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + (uVar20 ^ 0x10)),
                                auVar36._0_16_,auVar35._0_16_);
      auVar57 = vpminsd_avx(auVar57,auVar49._0_16_);
      auVar54 = vpminsd_avx(auVar54,auVar57);
      auVar8 = vpcmpgtd_avx(auVar8,auVar54);
      iVar10 = vmovmskps_avx(auVar8);
      if (iVar10 == 0xf) goto joined_r0x0055788e;
      bVar13 = (byte)iVar10 ^ 0xf;
      uVar11 = uVar21 & 0xfffffffffffffff0;
      lVar17 = 0;
      for (uVar21 = (ulong)bVar13; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
        lVar17 = lVar17 + 1;
      }
      uVar21 = *(ulong *)(uVar11 + lVar17 * 8);
      uVar16 = bVar13 - 1 & (uint)bVar13;
      uVar12 = (ulong)uVar16;
      if (uVar16 != 0) {
        *puVar18 = uVar21;
        lVar17 = 0;
        for (; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
          lVar17 = lVar17 + 1;
        }
        uVar16 = uVar16 - 1 & uVar16;
        uVar12 = (ulong)uVar16;
        bVar23 = uVar16 == 0;
        while( true ) {
          puVar18 = puVar18 + 1;
          uVar21 = *(ulong *)(uVar11 + lVar17 * 8);
          if (bVar23) break;
          *puVar18 = uVar21;
          lVar17 = 0;
          for (uVar21 = uVar12; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
            lVar17 = lVar17 + 1;
          }
          uVar12 = uVar12 - 1 & uVar12;
          bVar23 = uVar12 == 0;
        }
      }
    }
    uVar11 = (ulong)((uint)uVar21 & 0xf);
    if (uVar11 != 8) {
      uVar21 = uVar21 & 0xfffffffffffffff0;
      lVar17 = 0;
      do {
        lVar14 = lVar17 * 0xb0;
        auVar8 = *(undefined1 (*) [16])(uVar21 + 0x80 + lVar14);
        auVar54 = *(undefined1 (*) [16])(uVar21 + 0x40 + lVar14);
        auVar57 = *(undefined1 (*) [16])(uVar21 + 0x70 + lVar14);
        auVar43 = *(undefined1 (*) [16])(uVar21 + 0x50 + lVar14);
        auVar24._0_4_ = auVar8._0_4_ * auVar54._0_4_;
        auVar24._4_4_ = auVar8._4_4_ * auVar54._4_4_;
        auVar24._8_4_ = auVar8._8_4_ * auVar54._8_4_;
        auVar24._12_4_ = auVar8._12_4_ * auVar54._12_4_;
        local_970 = vfmsub231ps_fma(auVar24,auVar57,auVar43);
        auVar24 = *(undefined1 (*) [16])(uVar21 + 0x60 + lVar14);
        auVar29 = *(undefined1 (*) [16])(uVar21 + 0x30 + lVar14);
        auVar26._0_4_ = auVar43._0_4_ * auVar24._0_4_;
        auVar26._4_4_ = auVar43._4_4_ * auVar24._4_4_;
        auVar26._8_4_ = auVar43._8_4_ * auVar24._8_4_;
        auVar26._12_4_ = auVar43._12_4_ * auVar24._12_4_;
        local_960 = vfmsub231ps_fma(auVar26,auVar8,auVar29);
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar50._4_4_ = uVar1;
        auVar50._0_4_ = uVar1;
        auVar50._8_4_ = uVar1;
        auVar50._12_4_ = uVar1;
        auVar26 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + lVar14),auVar50);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar51._4_4_ = uVar1;
        auVar51._0_4_ = uVar1;
        auVar51._8_4_ = uVar1;
        auVar51._12_4_ = uVar1;
        auVar50 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x10 + lVar14),auVar51);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar52._4_4_ = uVar1;
        auVar52._0_4_ = uVar1;
        auVar52._8_4_ = uVar1;
        auVar52._12_4_ = uVar1;
        auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x20 + lVar14),auVar52);
        fVar38 = *(float *)(ray + k * 4 + 0x80);
        auVar53._4_4_ = fVar38;
        auVar53._0_4_ = fVar38;
        auVar53._8_4_ = fVar38;
        auVar53._12_4_ = fVar38;
        fVar40 = *(float *)(ray + k * 4 + 0xa0);
        auVar55._4_4_ = fVar40;
        auVar55._0_4_ = fVar40;
        auVar55._8_4_ = fVar40;
        auVar55._12_4_ = fVar40;
        fVar41 = *(float *)(ray + k * 4 + 0xc0);
        auVar56._4_4_ = fVar41;
        auVar56._0_4_ = fVar41;
        auVar56._8_4_ = fVar41;
        auVar56._12_4_ = fVar41;
        auVar58._0_4_ = fVar38 * auVar50._0_4_;
        auVar58._4_4_ = fVar38 * auVar50._4_4_;
        auVar58._8_4_ = fVar38 * auVar50._8_4_;
        auVar58._12_4_ = fVar38 * auVar50._12_4_;
        auVar34 = vfmsub231ps_fma(auVar58,auVar26,auVar55);
        auVar48._0_4_ = auVar8._0_4_ * auVar34._0_4_;
        auVar48._4_4_ = auVar8._4_4_ * auVar34._4_4_;
        auVar48._8_4_ = auVar8._8_4_ * auVar34._8_4_;
        auVar48._12_4_ = auVar8._12_4_ * auVar34._12_4_;
        auVar59._0_4_ = auVar43._0_4_ * auVar34._0_4_;
        auVar59._4_4_ = auVar43._4_4_ * auVar34._4_4_;
        auVar59._8_4_ = auVar43._8_4_ * auVar34._8_4_;
        auVar59._12_4_ = auVar43._12_4_ * auVar34._12_4_;
        auVar43._0_4_ = fVar41 * auVar26._0_4_;
        auVar43._4_4_ = fVar41 * auVar26._4_4_;
        auVar43._8_4_ = fVar41 * auVar26._8_4_;
        auVar43._12_4_ = fVar41 * auVar26._12_4_;
        auVar43 = vfmsub231ps_fma(auVar43,auVar51,auVar53);
        auVar8 = vfmadd231ps_fma(auVar48,auVar43,auVar57);
        auVar43 = vfmadd231ps_fma(auVar59,auVar54,auVar43);
        auVar34._0_4_ = auVar29._0_4_ * auVar57._0_4_;
        auVar34._4_4_ = auVar29._4_4_ * auVar57._4_4_;
        auVar34._8_4_ = auVar29._8_4_ * auVar57._8_4_;
        auVar34._12_4_ = auVar29._12_4_ * auVar57._12_4_;
        local_950 = vfmsub231ps_fma(auVar34,auVar24,auVar54);
        auVar60._0_4_ = fVar40 * auVar51._0_4_;
        auVar60._4_4_ = fVar40 * auVar51._4_4_;
        auVar60._8_4_ = fVar40 * auVar51._8_4_;
        auVar60._12_4_ = fVar40 * auVar51._12_4_;
        auVar34 = vfmsub231ps_fma(auVar60,auVar50,auVar56);
        auVar57._0_4_ = fVar41 * local_950._0_4_;
        auVar57._4_4_ = fVar41 * local_950._4_4_;
        auVar57._8_4_ = fVar41 * local_950._8_4_;
        auVar57._12_4_ = fVar41 * local_950._12_4_;
        auVar54 = vfmadd231ps_fma(auVar57,local_960,auVar55);
        auVar57 = vfmadd231ps_fma(auVar54,local_970,auVar53);
        auVar54 = vfmadd231ps_fma(auVar8,auVar34,auVar24);
        auVar8._4_4_ = uStack_a0c;
        auVar8._0_4_ = local_a10;
        auVar8._8_4_ = uStack_a08;
        auVar8._12_4_ = uStack_a04;
        auVar8 = vandps_avx(auVar57,auVar8);
        uVar16 = auVar8._0_4_;
        local_a00._0_4_ = (float)(uVar16 ^ auVar54._0_4_);
        uVar45 = auVar8._4_4_;
        local_a00._4_4_ = (float)(uVar45 ^ auVar54._4_4_);
        uVar46 = auVar8._8_4_;
        local_a00._8_4_ = (float)(uVar46 ^ auVar54._8_4_);
        uVar47 = auVar8._12_4_;
        local_a00._12_4_ = (float)(uVar47 ^ auVar54._12_4_);
        auVar8 = vfmadd231ps_fma(auVar43,auVar29,auVar34);
        local_9f0._0_4_ = (float)(uVar16 ^ auVar8._0_4_);
        local_9f0._4_4_ = (float)(uVar45 ^ auVar8._4_4_);
        local_9f0._8_4_ = (float)(uVar46 ^ auVar8._8_4_);
        local_9f0._12_4_ = (float)(uVar47 ^ auVar8._12_4_);
        auVar43 = ZEXT416(0) << 0x20;
        auVar8 = vcmpps_avx(local_a00,auVar43,5);
        auVar54 = vcmpps_avx(local_9f0,auVar43,5);
        auVar8 = vandps_avx(auVar8,auVar54);
        local_9d0 = vandps_avx(auVar57,local_a20);
        auVar54 = vcmpps_avx(auVar57,auVar43,4);
        auVar8 = vandps_avx(auVar8,auVar54);
        auVar54._0_4_ = local_a00._0_4_ + local_9f0._0_4_;
        auVar54._4_4_ = local_a00._4_4_ + local_9f0._4_4_;
        auVar54._8_4_ = local_a00._8_4_ + local_9f0._8_4_;
        auVar54._12_4_ = local_a00._12_4_ + local_9f0._12_4_;
        auVar54 = vcmpps_avx(auVar54,local_9d0,2);
        auVar57 = auVar54 & auVar8;
        if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar57[0xf] < '\0') {
          auVar8 = vandps_avx(auVar8,auVar54);
          auVar31._0_4_ = local_950._0_4_ * auVar51._0_4_;
          auVar31._4_4_ = local_950._4_4_ * auVar51._4_4_;
          auVar31._8_4_ = local_950._8_4_ * auVar51._8_4_;
          auVar31._12_4_ = local_950._12_4_ * auVar51._12_4_;
          auVar54 = vfmadd213ps_fma(auVar50,local_960,auVar31);
          auVar54 = vfmadd213ps_fma(auVar26,local_970,auVar54);
          local_9e0._0_4_ = (float)(uVar16 ^ auVar54._0_4_);
          local_9e0._4_4_ = (float)(uVar45 ^ auVar54._4_4_);
          local_9e0._8_4_ = (float)(uVar46 ^ auVar54._8_4_);
          local_9e0._12_4_ = (float)(uVar47 ^ auVar54._12_4_);
          fVar38 = *(float *)(ray + k * 4 + 0x60);
          auVar29._0_4_ = local_9d0._0_4_ * fVar38;
          auVar29._4_4_ = local_9d0._4_4_ * fVar38;
          auVar29._8_4_ = local_9d0._8_4_ * fVar38;
          auVar29._12_4_ = local_9d0._12_4_ * fVar38;
          auVar54 = vcmpps_avx(auVar29,local_9e0,1);
          fVar38 = *(float *)(ray + k * 4 + 0x100);
          auVar30 = ZEXT1664(CONCAT412(fVar38,CONCAT48(fVar38,CONCAT44(fVar38,fVar38))));
          auVar32._0_4_ = local_9d0._0_4_ * fVar38;
          auVar32._4_4_ = local_9d0._4_4_ * fVar38;
          auVar32._8_4_ = local_9d0._8_4_ * fVar38;
          auVar32._12_4_ = local_9d0._12_4_ * fVar38;
          auVar57 = vcmpps_avx(local_9e0,auVar32,2);
          auVar54 = vandps_avx(auVar54,auVar57);
          local_9b0 = vandps_avx(auVar8,auVar54);
          uVar16 = vmovmskps_avx(local_9b0);
          if (uVar16 != 0) {
            pSVar3 = context->scene;
            auVar8 = vrcpps_avx(local_9d0);
            auVar27._8_4_ = 0x3f800000;
            auVar27._0_8_ = 0x3f8000003f800000;
            auVar27._12_4_ = 0x3f800000;
            auVar54 = vfnmadd213ps_fma(local_9d0,auVar8,auVar27);
            auVar8 = vfmadd132ps_fma(auVar54,auVar8,auVar8);
            fVar38 = auVar8._0_4_;
            fVar40 = auVar8._4_4_;
            fVar41 = auVar8._8_4_;
            fVar42 = auVar8._12_4_;
            local_980[0] = fVar38 * local_9e0._0_4_;
            local_980[1] = fVar40 * local_9e0._4_4_;
            local_980[2] = fVar41 * local_9e0._8_4_;
            local_980[3] = fVar42 * local_9e0._12_4_;
            local_9a0[0] = fVar38 * local_a00._0_4_;
            local_9a0[1] = fVar40 * local_a00._4_4_;
            local_9a0[2] = fVar41 * local_a00._8_4_;
            local_9a0[3] = fVar42 * local_a00._12_4_;
            local_990._0_4_ = fVar38 * local_9f0._0_4_;
            local_990._4_4_ = fVar40 * local_9f0._4_4_;
            local_990._8_4_ = fVar41 * local_9f0._8_4_;
            local_990._12_4_ = fVar42 * local_9f0._12_4_;
            uVar12 = (ulong)(uVar16 & 0xff);
            do {
              local_ab0 = auVar30._0_16_;
              uVar7 = 0;
              for (uVar15 = uVar12; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                uVar7 = uVar7 + 1;
              }
              uVar16 = *(uint *)(lVar14 + uVar21 + 0x90 + uVar7 * 4);
              pGVar4 = (pSVar3->geometries).items[uVar16].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00557e32:
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                  return bVar9;
                }
                uVar15 = (ulong)(uint)((int)uVar7 * 4);
                uVar1 = *(undefined4 *)((long)local_9a0 + uVar15);
                local_8c0._4_4_ = uVar1;
                local_8c0._0_4_ = uVar1;
                local_8c0._8_4_ = uVar1;
                local_8c0._12_4_ = uVar1;
                local_8c0._16_4_ = uVar1;
                local_8c0._20_4_ = uVar1;
                local_8c0._24_4_ = uVar1;
                local_8c0._28_4_ = uVar1;
                local_8a0 = *(undefined4 *)(local_990 + uVar15);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_980 + uVar15);
                local_b10.context = context->user;
                uVar1 = *(undefined4 *)(lVar14 + uVar21 + 0xa0 + uVar15);
                local_880._4_4_ = uVar1;
                local_880._0_4_ = uVar1;
                local_880._8_4_ = uVar1;
                local_880._12_4_ = uVar1;
                local_880._16_4_ = uVar1;
                local_880._20_4_ = uVar1;
                local_880._24_4_ = uVar1;
                local_880._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(local_970 + uVar15);
                uVar2 = *(undefined4 *)(local_960 + uVar15);
                local_900._4_4_ = uVar2;
                local_900._0_4_ = uVar2;
                local_900._8_4_ = uVar2;
                local_900._12_4_ = uVar2;
                local_900._16_4_ = uVar2;
                local_900._20_4_ = uVar2;
                local_900._24_4_ = uVar2;
                local_900._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_950 + uVar15);
                local_8e0._4_4_ = uVar2;
                local_8e0._0_4_ = uVar2;
                local_8e0._8_4_ = uVar2;
                local_8e0._12_4_ = uVar2;
                local_8e0._16_4_ = uVar2;
                local_8e0._20_4_ = uVar2;
                local_8e0._24_4_ = uVar2;
                local_8e0._28_4_ = uVar2;
                local_860._4_4_ = uVar16;
                local_860._0_4_ = uVar16;
                local_860._8_4_ = uVar16;
                local_860._12_4_ = uVar16;
                local_860._16_4_ = uVar16;
                local_860._20_4_ = uVar16;
                local_860._24_4_ = uVar16;
                local_860._28_4_ = uVar16;
                local_920[0] = (RTCHitN)(char)uVar1;
                local_920[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[4] = (RTCHitN)(char)uVar1;
                local_920[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[8] = (RTCHitN)(char)uVar1;
                local_920[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0xc] = (RTCHitN)(char)uVar1;
                local_920[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0x10] = (RTCHitN)(char)uVar1;
                local_920[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0x14] = (RTCHitN)(char)uVar1;
                local_920[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0x18] = (RTCHitN)(char)uVar1;
                local_920[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0x1c] = (RTCHitN)(char)uVar1;
                local_920[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                uStack_89c = local_8a0;
                uStack_898 = local_8a0;
                uStack_894 = local_8a0;
                uStack_890 = local_8a0;
                uStack_88c = local_8a0;
                uStack_888 = local_8a0;
                uStack_884 = local_8a0;
                vpcmpeqd_avx2(local_8c0,local_8c0);
                uStack_83c = (local_b10.context)->instID[0];
                local_840 = uStack_83c;
                uStack_838 = uStack_83c;
                uStack_834 = uStack_83c;
                uStack_830 = uStack_83c;
                uStack_82c = uStack_83c;
                uStack_828 = uStack_83c;
                uStack_824 = uStack_83c;
                uStack_81c = (local_b10.context)->instPrimID[0];
                local_820 = uStack_81c;
                uStack_818 = uStack_81c;
                uStack_814 = uStack_81c;
                uStack_810 = uStack_81c;
                uStack_80c = uStack_81c;
                uStack_808 = uStack_81c;
                uStack_804 = uStack_81c;
                local_ae0 = local_940;
                local_b10.valid = (int *)local_ae0;
                local_b10.geometryUserPtr = pGVar4->userPtr;
                local_b10.hit = local_920;
                local_b10.N = 8;
                local_b10.ray = (RTCRayN *)ray;
                if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar4->occlusionFilterN)(&local_b10);
                }
                auVar6 = vpcmpeqd_avx2(local_ae0,_DAT_01faff00);
                auVar25 = _DAT_01fe9960 & ~auVar6;
                if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar25 >> 0x7f,0) == '\0') &&
                      (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar25 >> 0xbf,0) == '\0') &&
                    (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar25[0x1f]) {
                  auVar6 = auVar6 ^ _DAT_01fe9960;
                }
                else {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var5)(&local_b10);
                  }
                  auVar25 = vpcmpeqd_avx2(local_ae0,_DAT_01faff00);
                  auVar6 = auVar25 ^ _DAT_01fe9960;
                  auVar28._8_4_ = 0xff800000;
                  auVar28._0_8_ = 0xff800000ff800000;
                  auVar28._12_4_ = 0xff800000;
                  auVar28._16_4_ = 0xff800000;
                  auVar28._20_4_ = 0xff800000;
                  auVar28._24_4_ = 0xff800000;
                  auVar28._28_4_ = 0xff800000;
                  auVar25 = vblendvps_avx(auVar28,*(undefined1 (*) [32])(local_b10.ray + 0x100),
                                          auVar25);
                  *(undefined1 (*) [32])(local_b10.ray + 0x100) = auVar25;
                }
                if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar6 >> 0x7f,0) != '\0') ||
                      (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar6 >> 0xbf,0) != '\0') ||
                    (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar6[0x1f] < '\0') goto LAB_00557e32;
                auVar30 = ZEXT1664(local_ab0);
                *(int *)(ray + k * 4 + 0x100) = local_ab0._0_4_;
              }
              uVar12 = uVar12 ^ 1L << (uVar7 & 0x3f);
            } while (uVar12 != 0);
          }
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != uVar11 - 8);
    }
    auVar30 = ZEXT1664(local_a30);
    auVar33 = ZEXT1664(local_a40);
    auVar35 = ZEXT1664(local_a50);
    auVar37 = ZEXT1664(local_a60);
    auVar39 = ZEXT1664(local_a70);
    auVar44 = ZEXT1664(local_a80);
    auVar36 = ZEXT1664(local_a90);
    auVar49 = ZEXT1664(local_aa0);
joined_r0x0055788e:
    bVar9 = puVar18 != &local_800;
    if (!bVar9) {
      return bVar9;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }